

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::Graph::performLocalNameSearch(Graph *this,NameSearch *search,Statement *s)

{
  ProcessorInstance *o;
  pool_ptr<soul::AST::ProcessorInstance> i;
  undefined1 local_28 [16];
  
  ModuleBase::performLocalNameSearch((ModuleBase *)this,search,s);
  if (search->findProcessorInstances == true) {
    local_28._8_8_ = IdentifierPath::getLastPart(&search->partiallyQualifiedPath);
    findChildProcessor<soul::Identifier>((Graph *)local_28,(Identifier *)this);
    if ((ProcessorInstance *)local_28._0_8_ != (ProcessorInstance *)0x0) {
      o = pool_ptr<soul::AST::ProcessorInstance>::operator*
                    ((pool_ptr<soul::AST::ProcessorInstance> *)local_28);
      Scope::NameSearch::addResult(search,&o->super_ASTObject);
    }
  }
  return;
}

Assistant:

void performLocalNameSearch (NameSearch& search, const Statement* s) const override
        {
            ProcessorBase::performLocalNameSearch (search, s);

            if (search.findProcessorInstances)
                if (auto i = findChildProcessor (search.partiallyQualifiedPath.getLastPart()))
                    search.addResult (*i);
        }